

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

int __thiscall acto::core::runtime_t::shutdown(runtime_t *this,int __fd,int __how)

{
  mutex *__mutex;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  object_t *obj;
  __node_base _Var2;
  long *in_FS_OFFSET;
  actors_set actors;
  _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    __cxx_global_var_init();
  }
  anon_unknown_0::binding_context_t::process_actors
            ((binding_context_t *)(*in_FS_OFFSET + -0x50),true);
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if ((this->actors_)._M_h._M_element_count == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
    iVar1 = extraout_EAX_00;
  }
  else {
    obj = (object_t *)&this->actors_;
    if (obj != (object_t *)&local_48) {
      std::
      _Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_48,
                 (_Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)obj);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    for (_Var2._M_nxt = local_48._M_before_begin._M_nxt; _Var2._M_nxt != (_Hash_node_base *)0x0;
        _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
      obj = (object_t *)_Var2._M_nxt[1]._M_nxt;
      deconstruct_object(this,obj);
    }
    event::wait(&this->no_actors_event_,obj);
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
    iVar1 = extraout_EAX;
    if ((this->actors_)._M_h._M_element_count != 0) {
      __assert_fail("actors_.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                    ,0x137,"void acto::core::runtime_t::shutdown()");
    }
  }
  return iVar1;
}

Assistant:

void runtime_t::shutdown() {
  // Process all messages for binded actors and stop them.
  thread_context.process_actors(true);

  // Process shared actors.
  {
    actors_set actors;

    {
      std::lock_guard<std::mutex> g(mutex_);

      if (actors_.empty()) {
        return;
      } else {
        actors = actors_;
      }
    }

    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      deconstruct_object(*ai);
    }

    no_actors_event_.wait();
  }

  assert(actors_.empty());
}